

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O0

REF_STATUS ref_node_tet_jac_quality(REF_NODE ref_node,REF_INT *nodes,REF_DBL *quality)

{
  double dVar1;
  double local_2c0;
  double local_2b0;
  REF_STATUS ref_private_macro_code_rss_7;
  REF_STATUS ref_private_macro_code_rss_6;
  REF_STATUS ref_private_macro_code_rss_5;
  REF_STATUS ref_private_macro_code_rss_4;
  REF_STATUS ref_private_macro_code_rss_3;
  REF_STATUS ref_private_macro_code_rss_2;
  REF_STATUS ref_private_macro_code_rss_1;
  REF_STATUS ref_private_macro_code_rss;
  REF_DBL num;
  REF_DBL volume_in_metric;
  REF_DBL volume;
  REF_DBL det;
  REF_DBL l2;
  double dStack_258;
  REF_INT i;
  REF_DBL e5 [3];
  double local_238;
  REF_DBL e4 [3];
  double local_218;
  REF_DBL e3 [3];
  double local_1f8;
  REF_DBL e2 [3];
  double local_1d8;
  REF_DBL e1 [3];
  double local_1b8;
  REF_DBL e0 [3];
  REF_DBL local_198;
  REF_DBL jac [9];
  double local_148;
  REF_DBL m [6];
  REF_DBL mlog [6];
  REF_DBL mlog3 [6];
  REF_DBL mlog2 [6];
  REF_DBL mlog1 [6];
  REF_DBL mlog0 [6];
  REF_DBL *quality_local;
  REF_INT *nodes_local;
  REF_NODE ref_node_local;
  
  ref_node_local._4_4_ = ref_node_tet_vol(ref_node,nodes,&volume_in_metric);
  if (ref_node_local._4_4_ == 0) {
    if (ref_node->min_volume < volume_in_metric) {
      ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,*nodes,mlog1 + 5);
      if (ref_node_local._4_4_ == 0) {
        ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[1],mlog2 + 5);
        if (ref_node_local._4_4_ == 0) {
          ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[2],mlog3 + 5);
          if (ref_node_local._4_4_ == 0) {
            ref_node_local._4_4_ = ref_node_metric_get_log(ref_node,nodes[3],mlog + 5);
            if (ref_node_local._4_4_ == 0) {
              for (l2._4_4_ = 0; l2._4_4_ < 6; l2._4_4_ = l2._4_4_ + 1) {
                m[(long)l2._4_4_ + 5] =
                     (mlog1[(long)l2._4_4_ + 5] + mlog2[(long)l2._4_4_ + 5] +
                      mlog3[(long)l2._4_4_ + 5] + mlog[(long)l2._4_4_ + 5]) / 4.0;
              }
              ref_node_local._4_4_ = ref_matrix_exp_m(m + 5,&local_148);
              if (ref_node_local._4_4_ == 0) {
                ref_node_local._4_4_ = ref_matrix_jacob_m(&local_148,&local_198);
                if (ref_node_local._4_4_ == 0) {
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    e0[(long)l2._4_4_ + -1] =
                         ref_node->real[l2._4_4_ + nodes[1] * 0xf] -
                         ref_node->real[l2._4_4_ + *nodes * 0xf];
                  }
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    e1[(long)l2._4_4_ + -1] =
                         ref_node->real[l2._4_4_ + nodes[2] * 0xf] -
                         ref_node->real[l2._4_4_ + *nodes * 0xf];
                  }
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    e2[(long)l2._4_4_ + -1] =
                         ref_node->real[l2._4_4_ + nodes[3] * 0xf] -
                         ref_node->real[l2._4_4_ + *nodes * 0xf];
                  }
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    e3[(long)l2._4_4_ + -1] =
                         ref_node->real[l2._4_4_ + nodes[2] * 0xf] -
                         ref_node->real[l2._4_4_ + nodes[1] * 0xf];
                  }
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    e4[(long)l2._4_4_ + -1] =
                         ref_node->real[l2._4_4_ + nodes[3] * 0xf] -
                         ref_node->real[l2._4_4_ + nodes[1] * 0xf];
                  }
                  for (l2._4_4_ = 0; l2._4_4_ < 3; l2._4_4_ = l2._4_4_ + 1) {
                    *(double *)((long)&stack0xfffffffffffffda8 + (long)l2._4_4_ * 8) =
                         ref_node->real[l2._4_4_ + nodes[3] * 0xf] -
                         ref_node->real[l2._4_4_ + nodes[2] * 0xf];
                  }
                  det = e0[1] * (m[4] * e0[1] + m[1] * local_1b8 + m[3] * e0[0]) +
                        local_1b8 * (m[1] * e0[1] + local_148 * local_1b8 + m[0] * e0[0]) +
                        e0[0] * (m[3] * e0[1] + m[0] * local_1b8 + m[2] * e0[0]) +
                        e1[1] * (m[4] * e1[1] + m[1] * local_1d8 + m[3] * e1[0]) +
                        local_1d8 * (m[1] * e1[1] + local_148 * local_1d8 + m[0] * e1[0]) +
                        e1[0] * (m[3] * e1[1] + m[0] * local_1d8 + m[2] * e1[0]) +
                        e2[1] * (m[4] * e2[1] + m[1] * local_1f8 + m[3] * e2[0]) +
                        local_1f8 * (m[1] * e2[1] + local_148 * local_1f8 + m[0] * e2[0]) +
                        e2[0] * (m[3] * e2[1] + m[0] * local_1f8 + m[2] * e2[0]) +
                        e3[1] * (m[4] * e3[1] + m[1] * local_218 + m[3] * e3[0]) +
                        local_218 * (m[1] * e3[1] + local_148 * local_218 + m[0] * e3[0]) +
                        e3[0] * (m[3] * e3[1] + m[0] * local_218 + m[2] * e3[0]) +
                        e4[1] * (m[4] * e4[1] + m[1] * local_238 + m[3] * e4[0]) +
                        local_238 * (m[1] * e4[1] + local_148 * local_238 + m[0] * e4[0]) +
                        e4[0] * (m[3] * e4[1] + m[0] * local_238 + m[2] * e4[0]) +
                        e5[1] * (m[4] * e5[1] + m[1] * dStack_258 + m[3] * e5[0]) +
                        dStack_258 * (m[1] * e5[1] + local_148 * dStack_258 + m[0] * e5[0]) +
                        e5[0] * (m[3] * e5[1] + m[0] * dStack_258 + m[2] * e5[0]);
                  ref_node_local._4_4_ = ref_matrix_det_m(&local_148,&volume);
                  if (ref_node_local._4_4_ == 0) {
                    dVar1 = sqrt(volume);
                    dVar1 = pow(dVar1 * volume_in_metric,0.6666666666666666);
                    if (det * 1e+20 <= 0.0) {
                      local_2b0 = -(det * 1e+20);
                    }
                    else {
                      local_2b0 = det * 1e+20;
                    }
                    local_2c0 = dVar1;
                    if (dVar1 <= 0.0) {
                      local_2c0 = -dVar1;
                    }
                    if (local_2b0 <= local_2c0) {
                      *quality = -1.0;
                    }
                    else {
                      *quality = (dVar1 * 24.9610058766228) / det;
                    }
                    ref_node_local._4_4_ = 0;
                  }
                  else {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x78d,"ref_node_tet_jac_quality",(ulong)ref_node_local._4_4_,"det(mavg)"
                          );
                  }
                }
                else {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                         ,0x774,"ref_node_tet_jac_quality",(ulong)ref_node_local._4_4_,"jac");
                }
              }
              else {
                printf("%s: %d: %s: %d %s\n",
                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                       ,0x773,"ref_node_tet_jac_quality",(ulong)ref_node_local._4_4_,"exp");
              }
            }
            else {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                     ,0x770,"ref_node_tet_jac_quality",(ulong)ref_node_local._4_4_,"log3");
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                   0x76f,"ref_node_tet_jac_quality",(ulong)ref_node_local._4_4_,"log2");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
                 0x76e,"ref_node_tet_jac_quality",(ulong)ref_node_local._4_4_,"log1");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",
               0x76d,"ref_node_tet_jac_quality",(ulong)ref_node_local._4_4_,"log0");
      }
    }
    else {
      *quality = volume_in_metric - ref_node->min_volume;
      ref_node_local._4_4_ = 0;
    }
  }
  else {
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",0x767,
           "ref_node_tet_jac_quality",(ulong)ref_node_local._4_4_,"vol");
  }
  return ref_node_local._4_4_;
}

Assistant:

REF_FCN static REF_STATUS ref_node_tet_jac_quality(REF_NODE ref_node,
                                                   REF_INT *nodes,
                                                   REF_DBL *quality) {
  REF_DBL mlog0[6], mlog1[6], mlog2[6], mlog3[6];
  REF_DBL mlog[6], m[6], jac[9];
  REF_DBL e0[3], e1[3], e2[3], e3[3], e4[3], e5[3];
  REF_INT i;

  REF_DBL l2, det, volume, volume_in_metric, num;

  RSS(ref_node_tet_vol(ref_node, nodes, &volume), "vol");
  if (volume <= ref_node_min_volume(ref_node)) {
    *quality = volume - ref_node_min_volume(ref_node);
    return REF_SUCCESS;
  }

  RSS(ref_node_metric_get_log(ref_node, nodes[0], mlog0), "log0");
  RSS(ref_node_metric_get_log(ref_node, nodes[1], mlog1), "log1");
  RSS(ref_node_metric_get_log(ref_node, nodes[2], mlog2), "log2");
  RSS(ref_node_metric_get_log(ref_node, nodes[3], mlog3), "log3");
  for (i = 0; i < 6; i++)
    mlog[i] = (mlog0[i] + mlog1[i] + mlog2[i] + mlog3[i]) / 4.0;
  RSS(ref_matrix_exp_m(mlog, m), "exp");
  RSS(ref_matrix_jacob_m(m, jac), "jac");

  for (i = 0; i < 3; i++)
    e0[i] = ref_node_xyz(ref_node, i, nodes[1]) -
            ref_node_xyz(ref_node, i, nodes[0]);
  for (i = 0; i < 3; i++)
    e1[i] = ref_node_xyz(ref_node, i, nodes[2]) -
            ref_node_xyz(ref_node, i, nodes[0]);
  for (i = 0; i < 3; i++)
    e2[i] = ref_node_xyz(ref_node, i, nodes[3]) -
            ref_node_xyz(ref_node, i, nodes[0]);
  for (i = 0; i < 3; i++)
    e3[i] = ref_node_xyz(ref_node, i, nodes[2]) -
            ref_node_xyz(ref_node, i, nodes[1]);
  for (i = 0; i < 3; i++)
    e4[i] = ref_node_xyz(ref_node, i, nodes[3]) -
            ref_node_xyz(ref_node, i, nodes[1]);
  for (i = 0; i < 3; i++)
    e5[i] = ref_node_xyz(ref_node, i, nodes[3]) -
            ref_node_xyz(ref_node, i, nodes[2]);

  l2 = ref_matrix_vt_m_v(m, e0) + ref_matrix_vt_m_v(m, e1) +
       ref_matrix_vt_m_v(m, e2) + ref_matrix_vt_m_v(m, e3) +
       ref_matrix_vt_m_v(m, e4) + ref_matrix_vt_m_v(m, e5);

  RSS(ref_matrix_det_m(m, &det), "det(mavg)");
  volume_in_metric = sqrt(det) * volume;

  num = pow(volume_in_metric, 2.0 / 3.0);

  if (ref_math_divisible(num, l2)) {
    /* 36/3^(1/3) */
    *quality = 24.9610058766228 * num / l2;
  } else {
    /* printf("%s: %d: %s: div zero vol %.18e (%.18e / %.18e)\n", __FILE__,
       __LINE__, __func__, volume, num, l2); */
    *quality = -1.0;
  }

  return REF_SUCCESS;
}